

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemExpr_RefFunc
          (SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  Var *__s;
  uint local_6c;
  Var local_68;
  
  RVar1 = CheckType(this,loc,(Type)0xfffffffffffffff0,
                    (this->elems_).
                    super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].element,"elem expression");
  Var::Var(&local_68,func_var);
  __s = &local_68;
  RVar2 = CheckFuncIndex(this,&local_68,(FuncType *)0x0);
  Var::~Var(&local_68);
  pcVar3 = Var::index(func_var,(char *)__s,__c);
  local_6c = (uint)pcVar3;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_6c);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result SharedValidator::OnElemSegmentElemExpr_RefFunc(const Location& loc,
                                                      Var func_var) {
  Result result = Result::Ok;
  result |=
      CheckType(loc, Type::FuncRef, elems_.back().element, "elem expression");
  result |= CheckFuncIndex(func_var);
  declared_funcs_.insert(func_var.index());
  return result;
}